

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

bool __thiscall Scope::Equals(Scope *this,Scope *s)

{
  value_type vVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index i;
  size_t siz;
  uint local_24;
  bool local_1;
  
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
  if (sVar2 == sVar3) {
    for (local_24 = 0; local_24 < sVar2; local_24 = local_24 + 1) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,(ulong)local_24);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RSI,(ulong)local_24);
      if (vVar1 != *pvVar4) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Scope::Equals(const Scope& s) const
{
    size_t siz= this->size();
    if(siz != s.size())
        return false;

    for(Index i=0; i < siz; i++)
        if( (*this)[i] != s[i] )
            return false;

    return true;

}